

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O0

FT_Error cf2_getT1SeacComponent(PS_Decoder *decoder,FT_UInt glyph_index,CF2_Buffer buf)

{
  FT_Face pFVar1;
  FT_Incremental_InterfaceRec *pFVar2;
  ulong uVar3;
  FT_ULong charstring_len;
  FT_Byte *charstring_base;
  FT_Incremental_InterfaceRec *inc;
  T1_Font type1;
  T1_Face face;
  undefined1 auStack_30 [4];
  FT_Error error;
  FT_Data glyph_data;
  CF2_Buffer buf_local;
  FT_UInt glyph_index_local;
  PS_Decoder *decoder_local;
  
  face._4_4_ = 0;
  pFVar1 = (decoder->builder).face;
  pFVar2 = pFVar1->internal->incremental_interface;
  glyph_data._8_8_ = buf;
  if (pFVar2 == (FT_Incremental_InterfaceRec *)0x0) {
    _auStack_30 = (&(pFVar1[2].size)->face)[glyph_index];
    glyph_data.pointer._0_4_ = *(uint *)((long)&(pFVar1[2].charmap)->face + (ulong)glyph_index * 4);
  }
  else {
    face._4_4_ = (*pFVar2->funcs->get_glyph_data)(pFVar2->object,glyph_index,(FT_Data *)auStack_30);
  }
  pFVar1 = _auStack_30;
  if (face._4_4_ == 0) {
    uVar3 = (ulong)(uint)glyph_data.pointer;
    memset((void *)glyph_data._8_8_,0,0x20);
    *(FT_Face *)(glyph_data._8_8_ + 0x18) = pFVar1;
    *(FT_Face *)(glyph_data._8_8_ + 8) = pFVar1;
    *(ulong *)(glyph_data._8_8_ + 0x10) = (long)&pFVar1->num_faces + uVar3;
  }
  return face._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cf2_getT1SeacComponent( PS_Decoder*  decoder,
                          FT_UInt      glyph_index,
                          CF2_Buffer   buf )
  {
    FT_Data   glyph_data;
    FT_Error  error = FT_Err_Ok;
    T1_Face   face  = (T1_Face)decoder->builder.face;
    T1_Font   type1 = &face->type1;

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    FT_Incremental_InterfaceRec  *inc =
      face->root.internal->incremental_interface;


    /* For incremental fonts get the character data using the */
    /* callback function.                                     */
    if ( inc )
      error = inc->funcs->get_glyph_data( inc->object,
                                          glyph_index, &glyph_data );
    else
#endif
    /* For ordinary fonts get the character data stored in the face record. */
    {
      glyph_data.pointer = type1->charstrings[glyph_index];
      glyph_data.length  = type1->charstrings_len[glyph_index];
    }

    if ( !error )
    {
      FT_Byte*  charstring_base = (FT_Byte*)glyph_data.pointer;
      FT_ULong  charstring_len  = glyph_data.length;


      FT_ASSERT( charstring_base + charstring_len >= charstring_base );

      FT_ZERO( buf );
      buf->start =
      buf->ptr   = charstring_base;
      buf->end   = charstring_base + charstring_len;
    }

    return error;
  }